

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

TypeFunction *
GetGenericFunctionInstanceType
          (ExpressionContext *ctx,SynBase *source,TypeBase *parentType,FunctionData *function,
          ArrayView<CallArgumentData> arguments,IntrusiveList<MatchData> *aliases)

{
  SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
  *this;
  __jmp_buf_tag *__env;
  SynIdentifier *pSVar1;
  SynBase *pSVar2;
  ArgumentData *pAVar3;
  IntrusiveList<MatchData> aliases_00;
  IntrusiveList<TypeHandle> arguments_00;
  IntrusiveList<TypeHandle> arguments_01;
  bool bVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  MatchData *pMVar8;
  GenericFunctionInstanceTypeResponse *pGVar9;
  SynFunctionDefinition *pSVar10;
  TypeBase *pTVar11;
  TypeBase *actualType;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SynFunctionArgument *source_00;
  undefined4 extraout_var_03;
  TypeFunction *pTVar12;
  uint uVar13;
  CallArgumentData *pCVar14;
  uint uVar15;
  MatchData *pMVar16;
  ExprBase **ppEVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  bool failed;
  IntrusiveList<TypeHandle> types;
  IntrusiveList<TypeHandle> incomingArguments;
  IntrusiveList<MatchData> incomingAliases;
  GenericFunctionInstanceTypeRequest request;
  jmp_buf prevErrorHandler;
  GenericFunctionInstanceTypeResponse local_1b0;
  IntrusiveList<TypeHandle> local_198;
  TypeBase *local_188;
  ScopeData *local_180;
  IntrusiveList<TypeHandle> local_178;
  ulong local_160;
  long local_158;
  __jmp_buf_tag *local_150;
  IntrusiveList<MatchData> local_148;
  GenericFunctionInstanceTypeRequest local_130;
  undefined1 local_f8 [200];
  TypeHandle *pTVar7;
  undefined4 extraout_var_00;
  
  pCVar14 = arguments.data;
  uVar15 = arguments.count;
  local_188 = parentType;
  if ((function->arguments).count != uVar15) {
    __assert_fail("function->arguments.size() == arguments.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x188b,
                  "TypeFunction *GetGenericFunctionInstanceType(ExpressionContext &, SynBase *, TypeBase *, FunctionData *, ArrayView<CallArgumentData>, IntrusiveList<MatchData> &)"
                 );
  }
  local_178.head = (TypeHandle *)0x0;
  local_178.tail = (TypeHandle *)0x0;
  local_148.head = (MatchData *)0x0;
  local_148.tail = (MatchData *)0x0;
  if (uVar15 != 0) {
    lVar19 = 0;
    do {
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
      pTVar7 = (TypeHandle *)CONCAT44(extraout_var,iVar6);
      pTVar7->type = *(TypeBase **)((long)&pCVar14->type + lVar19);
      pTVar7->next = (TypeHandle *)0x0;
      pTVar7->listed = false;
      IntrusiveList<TypeHandle>::push_back(&local_178,pTVar7);
      lVar19 = lVar19 + 0x10;
    } while ((ulong)uVar15 << 4 != lVar19);
  }
  pMVar16 = aliases->head;
  if (pMVar16 != (MatchData *)0x0) {
    do {
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pMVar8 = (MatchData *)CONCAT44(extraout_var_00,iVar6);
      pSVar1 = pMVar16->name;
      pTVar11 = pMVar16->type;
      pMVar8->name = pSVar1;
      pMVar8->type = pTVar11;
      pMVar8->next = (MatchData *)0x0;
      pMVar8->listed = false;
      if (pSVar1 == (SynIdentifier *)0x0) {
        __assert_fail("name",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                      ,0xf6,"MatchData::MatchData(SynIdentifier *, TypeBase *)");
      }
      IntrusiveList<MatchData>::push_back(&local_148,pMVar8);
      pMVar16 = pMVar16->next;
    } while (pMVar16 != (MatchData *)0x0);
  }
  arguments_01.tail = local_178.tail;
  arguments_01.head = local_178.head;
  aliases_00.tail._0_4_ = (int)local_148.tail;
  aliases_00.head = local_148.head;
  aliases_00.tail._4_4_ = (int)((ulong)local_148.tail >> 0x20);
  pTVar12 = (TypeFunction *)local_178.head;
  GenericFunctionInstanceTypeRequest::GenericFunctionInstanceTypeRequest
            (&local_130,local_188,function,arguments_01,aliases_00);
  this = &ctx->genericFunctionInstanceTypeMap;
  pGVar9 = SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
           ::find(this,&local_130);
  if (pGVar9 == (GenericFunctionInstanceTypeResponse *)0x0) {
    local_180 = ctx->scope;
    pSVar2 = function->source;
    ctx->scope = function->scope;
    ctx->lookupLocation = pSVar2;
    local_198.head = (TypeHandle *)0x0;
    local_198.tail = (TypeHandle *)0x0;
    __env = ctx->errorHandler;
    memcpy(local_f8,__env,200);
    bVar21 = ctx->errorHandlerNested;
    ctx->errorHandlerNested = true;
    uVar13 = *(uint *)(NULLC::traceContext + 0x244);
    iVar6 = _setjmp((__jmp_buf_tag *)__env);
    if (iVar6 != 0) {
      NULLC::TraceLeaveTo(uVar13);
      ctx->scope = local_180;
      ctx->lookupLocation = (SynBase *)0x0;
      memcpy(__env,local_f8,200);
      ctx->errorHandlerNested = bVar21;
      longjmp((__jmp_buf_tag *)__env,1);
    }
    pSVar10 = GetGenericFunctionDefinition(ctx,source,function);
    local_150 = __env;
    if (pSVar10 == (SynFunctionDefinition *)0x0) {
      if (function->importModule != (ModuleData *)0x0) {
        anon_unknown.dwarf_9fd58::Stop
                  (ctx,source,"ERROR: imported generic function call is not supported");
      }
      bVar5 = (function->arguments).count == 0;
      if (!bVar5) {
        local_160 = (ulong)uVar15;
        ppEVar17 = &pCVar14->value;
        uVar18 = 0;
        uVar20 = uVar18;
        do {
          if (local_160 == uVar20) goto LAB_0016274a;
          pAVar3 = (function->arguments).data;
          pTVar11 = MatchArgumentType(ctx,*(SynBase **)((long)&pAVar3->source + uVar18),
                                      *(TypeBase **)((long)&pAVar3->type + uVar18),
                                      ((CallArgumentData *)(ppEVar17 + -1))->type,*ppEVar17,aliases)
          ;
          if ((pTVar11 == (TypeBase *)0x0) || (pTVar11->typeID == 0)) {
            local_1b0.aliases.head = aliases->head;
            local_1b0.aliases.tail = aliases->tail;
            local_1b0.functionType = (TypeFunction *)0x0;
            SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
            ::insert(this,&local_130,&local_1b0);
            bVar4 = false;
            pTVar12 = (TypeFunction *)0x0;
          }
          else {
            iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
            pTVar7 = (TypeHandle *)CONCAT44(extraout_var_03,iVar6);
            pTVar7->type = pTVar11;
            pTVar7->next = (TypeHandle *)0x0;
            pTVar7->listed = false;
            IntrusiveList<TypeHandle>::push_back(&local_198,pTVar7);
            bVar4 = true;
          }
          if (!bVar4) break;
          uVar20 = uVar20 + 1;
          uVar18 = uVar18 + 0x30;
          ppEVar17 = ppEVar17 + 2;
          bVar4 = uVar20 < (function->arguments).count;
          bVar5 = !bVar4;
        } while (bVar4);
      }
    }
    else {
      bVar4 = RestoreParentTypeScope(ctx,source,local_188);
      ExpressionContext::PushTemporaryScope(ctx);
      source_00 = (pSVar10->arguments).head;
      if (source_00 != (SynFunctionArgument *)0x0) {
        local_158 = (ulong)uVar15 * 0x10 + 0x10;
        lVar19 = 0;
        while( true ) {
          local_1b0.functionType =
               (TypeFunction *)((ulong)local_1b0.functionType & 0xffffffffffffff00);
          pTVar11 = AnalyzeType(ctx,source_00->type,true,(bool *)&local_1b0);
          if ((char)local_1b0.functionType != '\0') break;
          if (local_158 == lVar19 + 0x10) {
LAB_0016274a:
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x22a,
                          "T &ArrayView<CallArgumentData>::operator[](unsigned int) [T = CallArgumentData]"
                         );
          }
          actualType = *(TypeBase **)((long)&pCVar14->type + lVar19);
          if (pTVar11 != ctx->typeAuto) {
            actualType = MatchArgumentType(ctx,&source_00->super_SynBase,pTVar11,actualType,
                                           *(ExprBase **)((long)&pCVar14->value + lVar19),aliases);
          }
          if ((actualType == (TypeBase *)0x0) || (actualType->typeID == 0)) break;
          iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
          pSVar1 = source_00->name;
          uVar13 = ctx->uniqueVariableId;
          ctx->uniqueVariableId = uVar13 + 1;
          VariableData::VariableData
                    ((VariableData *)CONCAT44(extraout_var_01,iVar6),ctx->allocator,
                     &source_00->super_SynBase,ctx->scope,0,actualType,pSVar1,0,uVar13);
          ExpressionContext::AddVariable(ctx,(VariableData *)CONCAT44(extraout_var_01,iVar6),true);
          iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
          pTVar7 = (TypeHandle *)CONCAT44(extraout_var_02,iVar6);
          pTVar7->type = actualType;
          pTVar7->next = (TypeHandle *)0x0;
          pTVar7->listed = false;
          IntrusiveList<TypeHandle>::push_back(&local_198,pTVar7);
          source_00 = (SynFunctionArgument *)(source_00->super_SynBase).next;
          if ((source_00 == (SynFunctionArgument *)0x0) ||
             ((source_00->super_SynBase).typeID != 0x36)) {
            source_00 = (SynFunctionArgument *)0x0;
          }
          lVar19 = lVar19 + 0x10;
          if (source_00 == (SynFunctionArgument *)0x0) break;
        }
      }
      ExpressionContext::PopScope(ctx,SCOPE_TEMPORARY,true);
      bVar5 = true;
      if (bVar4) {
        ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
      }
    }
    if (bVar5) {
      ctx->scope = local_180;
      ctx->lookupLocation = (SynBase *)0x0;
      memcpy(local_150,local_f8,200);
      ctx->errorHandlerNested = bVar21;
      if (local_198.head == (TypeHandle *)0x0) {
        uVar13 = 0;
      }
      else {
        uVar13 = 0;
        pTVar7 = local_198.head;
        do {
          uVar13 = uVar13 + 1;
          pTVar7 = pTVar7->next;
        } while (pTVar7 != (TypeHandle *)0x0);
      }
      if (uVar13 == uVar15) {
        for (pMVar16 = (function->generics).head; pMVar16 != (MatchData *)0x0;
            pMVar16 = pMVar16->next) {
          pMVar8 = aliases->head;
          bVar21 = pMVar8 == (MatchData *)0x0;
          if (bVar21) {
LAB_00162629:
            local_1b0.aliases.head = aliases->head;
            local_1b0.aliases.tail = aliases->tail;
            local_1b0.functionType = (TypeFunction *)0x0;
            SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
            ::insert(this,&local_130,&local_1b0);
            pTVar12 = (TypeFunction *)0x0;
          }
          else {
            bVar5 = InplaceStr::operator==(&pMVar16->name->name,&pMVar8->name->name);
            while (!bVar5) {
              pMVar8 = pMVar8->next;
              bVar21 = pMVar8 == (MatchData *)0x0;
              if (bVar21) goto LAB_00162629;
              bVar5 = InplaceStr::operator==(&pMVar16->name->name,&pMVar8->name->name);
            }
          }
          if (bVar21) break;
        }
        if (pMVar16 == (MatchData *)0x0) {
          arguments_00.tail = local_198.tail;
          arguments_00.head = local_198.head;
          pTVar12 = ExpressionContext::GetFunctionType
                              (ctx,source,function->type->returnType,arguments_00);
          local_1b0.aliases.head = aliases->head;
          local_1b0.aliases.tail = aliases->tail;
          local_1b0.functionType = pTVar12;
          SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
          ::insert(this,&local_130,&local_1b0);
        }
      }
      else {
        local_1b0.aliases.head = aliases->head;
        local_1b0.aliases.tail = aliases->tail;
        local_1b0.functionType = (TypeFunction *)0x0;
        SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
        ::insert(this,&local_130,&local_1b0);
        pTVar12 = (TypeFunction *)0x0;
      }
    }
  }
  else {
    pMVar16 = (pGVar9->aliases).tail;
    aliases->head = (pGVar9->aliases).head;
    aliases->tail = pMVar16;
    pTVar12 = pGVar9->functionType;
  }
  return pTVar12;
}

Assistant:

TypeFunction* GetGenericFunctionInstanceType(ExpressionContext &ctx, SynBase *source, TypeBase *parentType, FunctionData *function, ArrayView<CallArgumentData> arguments, IntrusiveList<MatchData> &aliases)
{
	assert(function->arguments.size() == arguments.size());

	// Lookup previous match for this function
	IntrusiveList<TypeHandle> incomingArguments;
	IntrusiveList<MatchData> incomingAliases;

	for(unsigned i = 0; i < arguments.size(); i++)
		incomingArguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(arguments[i].type));

	for(MatchData *curr = aliases.head; curr; curr = curr->next)
		incomingAliases.push_back(new (ctx.get<MatchData>()) MatchData(curr->name, curr->type));

	GenericFunctionInstanceTypeRequest request(parentType, function, incomingArguments, incomingAliases);

	if(GenericFunctionInstanceTypeResponse* response = ctx.genericFunctionInstanceTypeMap.find(request))
	{
		aliases = response->aliases;

		return response->functionType;
	}

	// Switch to original function scope
	ScopeData *scope = ctx.scope;

	ctx.SwitchToScopeAtPoint(function->scope, function->source);

	IntrusiveList<TypeHandle> types;

	jmp_buf prevErrorHandler;
	memcpy(&prevErrorHandler, &ctx.errorHandler, sizeof(jmp_buf));

	bool prevErrorHandlerNested = ctx.errorHandlerNested;
	ctx.errorHandlerNested = true;

	unsigned traceDepth = NULLC::TraceGetDepth();

	if(!setjmp(ctx.errorHandler))
	{
		if(SynFunctionDefinition *syntax = GetGenericFunctionDefinition(ctx, source, function))
		{
			bool addedParentScope = RestoreParentTypeScope(ctx, source, parentType);

			// Create temporary scope with known arguments for reference in type expression
			ctx.PushTemporaryScope();

			unsigned pos = 0;

			for(SynFunctionArgument *argument = syntax->arguments.head; argument; argument = getType<SynFunctionArgument>(argument->next), pos++)
			{
				bool failed = false;
				TypeBase *expectedType = AnalyzeType(ctx, argument->type, true, &failed);

				if(failed)
					break;

				CallArgumentData &actualArgument = arguments[pos];

				TypeBase *type = expectedType == ctx.typeAuto ? actualArgument.type : MatchArgumentType(ctx, argument, expectedType, actualArgument.type, actualArgument.value, aliases);

				if(!type || isType<TypeError>(type))
					break;

				ctx.AddVariable(new (ctx.get<VariableData>()) VariableData(ctx.allocator, argument, ctx.scope, 0, type, argument->name, 0, ctx.uniqueVariableId++), true);

				types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(type));
			}

			ctx.PopScope(SCOPE_TEMPORARY);

			if(addedParentScope)
				ctx.PopScope(SCOPE_TYPE);
		}
		else
		{
			if(function->importModule)
				Stop(ctx, source, "ERROR: imported generic function call is not supported");

			for(unsigned i = 0; i < function->arguments.size(); i++)
			{
				ArgumentData &funtionArgument = function->arguments[i];

				CallArgumentData &actualArgument = arguments[i];

				TypeBase *type = MatchArgumentType(ctx, funtionArgument.source, funtionArgument.type, actualArgument.type, actualArgument.value, aliases);

				if(!type || isType<TypeError>(type))
				{
					ctx.genericFunctionInstanceTypeMap.insert(request, GenericFunctionInstanceTypeResponse(NULL, aliases));

					// TODO: what about scope restore
					return NULL;
				}

				types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(type));
			}
		}
	}
	else
	{
		NULLC::TraceLeaveTo(traceDepth);

		// Restore old scope
		ctx.SwitchToScopeAtPoint(scope, NULL);

		memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		ctx.errorHandlerNested = prevErrorHandlerNested;

		longjmp(ctx.errorHandler, 1);
	}

	// Restore old scope
	ctx.SwitchToScopeAtPoint(scope, NULL);

	memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
	ctx.errorHandlerNested = prevErrorHandlerNested;

	if(types.size() != arguments.size())
	{
		ctx.genericFunctionInstanceTypeMap.insert(request, GenericFunctionInstanceTypeResponse(NULL, aliases));

		return NULL;
	}

	// Check that all generics have been resolved
	for(MatchData *curr = function->generics.head; curr; curr = curr->next)
	{
		bool matched = false;

		for(MatchData *alias = aliases.head; alias; alias = alias->next)
		{
			if(curr->name->name == alias->name->name)
			{
				matched = true;
				break;
			}
		}

		if(!matched)
		{
			ctx.genericFunctionInstanceTypeMap.insert(request, GenericFunctionInstanceTypeResponse(NULL, aliases));

			return NULL;
		}
	}

	TypeFunction *typeFunction = ctx.GetFunctionType(source, function->type->returnType, types);

	ctx.genericFunctionInstanceTypeMap.insert(request, GenericFunctionInstanceTypeResponse(typeFunction, aliases));

	return typeFunction;
}